

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<double,long_long,int(*)(char_const**,double*)>
               (longlong num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  float fVar8;
  uint extraout_EDX;
  undefined7 in_register_00000011;
  double dVar9;
  long lVar10;
  char *unaff_RBP;
  byte *pbVar11;
  char *pcVar12;
  char (*mp_nums_00) [16];
  code *pcVar13;
  char *fmt;
  char cVar14;
  ulong uVar15;
  undefined8 uVar16;
  char *pcVar17;
  undefined *puVar18;
  char *pcVar19;
  bool bVar20;
  char *mp_num_pos2;
  double num2;
  char str [256];
  char mp_nums [16] [16];
  double dStack_6e8;
  undefined1 *puStack_6e0;
  char acStack_6d8 [256];
  undefined1 uStack_5d8;
  undefined8 uStack_5d7;
  undefined1 auStack_5cf [255];
  char (*pacStack_4d0) [16];
  undefined8 uStack_4c8;
  undefined *puStack_4c0;
  code *pcStack_4b8;
  double dStack_4b0;
  byte *pbStack_4a8;
  char acStack_4a0 [256];
  byte abStack_3a0 [16];
  byte abStack_390 [248];
  long lStack_298;
  ulong uStack_290;
  char *pcStack_288;
  char *pcStack_280;
  char *pcStack_278;
  code *pcStack_270;
  ulong local_268;
  char *local_260;
  float local_258;
  undefined4 local_254;
  double local_250;
  double local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  char local_238 [256];
  byte local_138;
  undefined8 local_137;
  char acStack_12f [255];
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,is_ok);
  builtin_strncpy(local_238,"typed read of ",0xf);
  pcStack_270 = (code *)0x138ef1;
  local_240 = read_f;
  iVar2 = snprintf(local_238 + 0xe,0xf2,"%lld",num1);
  pcVar17 = local_238 + (long)iVar2 + 0xe;
  pcStack_270 = (code *)0x138f12;
  iVar2 = snprintf(pcVar17,(size_t)(&local_138 + -(long)pcVar17)," into ");
  pcStack_270 = (code *)0x138f2c;
  snprintf(pcVar17 + iVar2,(size_t)(&local_138 + -(long)(pcVar17 + iVar2)),"double");
  pcStack_270 = (code *)0x138f3b;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x138f54;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x138f61;
  fputs(local_238,_stdout);
  pcStack_270 = (code *)0x138f6e;
  fputc(10,_stdout);
  mp_nums_00 = (char (*) [16])&local_138;
  pcStack_270 = (code *)0x138f82;
  local_268 = num1;
  uVar3 = test_encode_int_all_sizes(mp_nums_00,num1);
  if (0 < (int)uVar3) {
    local_258 = (float)(long)local_268;
    local_250 = (double)(long)local_268;
    uVar15 = (ulong)uVar3;
    pcVar19 = (char *)((long)&local_137 + 1);
    lVar10 = 0;
    do {
      lVar4 = lVar10 * 0x10;
      bVar6 = pcVar19[-2];
      uVar7 = (ulong)bVar6;
      mVar1 = mp_type_hint[uVar7];
      pcVar12 = pcVar19;
      if (mVar1 == MP_UINT) {
        switch(bVar6) {
        case 0xcc:
          uVar7 = (ulong)(byte)pcVar19[-1];
          break;
        case 0xcd:
          uVar7 = (ulong)(ushort)(*(ushort *)(pcVar19 + -1) << 8 | *(ushort *)(pcVar19 + -1) >> 8);
          pcVar12 = acStack_12f + lVar4 + -6;
          break;
        case 0xce:
          uVar3 = *(uint *)(pcVar19 + -1);
          uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          pcVar12 = acStack_12f + lVar4 + -4;
          break;
        case 0xcf:
          uVar7 = *(ulong *)(pcVar19 + -1);
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
          pcVar12 = acStack_12f + lVar10 * 0x10;
          break;
        default:
          if ((char)bVar6 < '\0') {
LAB_00139276:
            pcStack_270 = (code *)0x13927b;
            test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
            pcStack_270 = (code *)0x139280;
            test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
            pcStack_270 = (code *)0x13929f;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar12 = acStack_12f + (lVar10 * 2 + -1) * 8;
        }
        if (uVar7 != local_268) {
          pcStack_270 = (code *)0x1392c8;
          test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
          pcStack_270 = test_read_num<double,float,int(*)(char_const**,double*)>;
          test_read_num<double,long_long,int(*)(char_const**,double*)>();
          builtin_strncpy(acStack_4a0,"typed read of ",0xf);
          uVar16 = CONCAT71((int7)(uVar15 >> 8),1);
          pcStack_4b8 = (code *)0x13932e;
          lStack_298 = lVar10;
          uStack_290 = uVar15;
          pcStack_288 = pcVar17;
          pcStack_280 = pcVar12;
          pcStack_278 = pcVar19;
          pcStack_270 = (code *)unaff_RBP;
          iVar2 = snprintf(acStack_4a0 + 0xe,0xf2,"%f",0x41590b2200000000);
          pcVar17 = acStack_4a0 + (long)iVar2 + 0xe;
          pcStack_4b8 = (code *)0x13934f;
          iVar2 = snprintf(pcVar17,(size_t)(abStack_3a0 + -(long)pcVar17)," into ");
          pcStack_4b8 = (code *)0x139369;
          snprintf(pcVar17 + iVar2,(size_t)(abStack_3a0 + -(long)(pcVar17 + iVar2)),"double");
          puVar18 = &stdout;
          pcStack_4b8 = (code *)0x139378;
          _space((FILE *)_stdout);
          pcStack_4b8 = (code *)0x139391;
          fwrite("# ",2,1,_stdout);
          pcStack_4b8 = (code *)0x13939e;
          fputs(acStack_4a0,_stdout);
          pcVar13 = (code *)0xa;
          pcStack_4b8 = (code *)0x1393ab;
          fputc(10,_stdout);
          abStack_3a0[0] = 0xca;
          abStack_3a0[1] = 0x4a;
          abStack_3a0[2] = 200;
          abStack_3a0[3] = 0x59;
          abStack_3a0[4] = 0x10;
          abStack_390[0] = 0xcb;
          abStack_390[1] = 0x41;
          abStack_390[2] = 0x59;
          abStack_390[3] = 0xb;
          abStack_390[4] = 0x22;
          abStack_390[5] = 0;
          abStack_390[6] = 0;
          abStack_390[7] = 0;
          abStack_390[8] = 0;
          pbVar5 = abStack_3a0;
          goto LAB_001393db;
        }
      }
      else if (mVar1 == MP_FLOAT) {
        if (bVar6 != 0xca) {
LAB_001392a4:
          pcStack_270 = (code *)0x1392c3;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        uVar3 = *(uint *)(pcVar19 + -1);
        fVar8 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        if ((fVar8 != local_258) || (NAN(fVar8) || NAN(local_258))) goto LAB_0013927b;
        pcVar12 = pcVar19 + 3;
      }
      else if (mVar1 == MP_INT) {
        uVar7 = (ulong)(char)bVar6;
        switch(bVar6) {
        case 0xd0:
          uVar7 = (ulong)pcVar19[-1];
          break;
        case 0xd1:
          uVar7 = (ulong)(short)(*(ushort *)(pcVar19 + -1) << 8 | *(ushort *)(pcVar19 + -1) >> 8);
          pcVar12 = acStack_12f + lVar4 + -6;
          break;
        case 0xd2:
          uVar3 = *(uint *)(pcVar19 + -1);
          uVar7 = (ulong)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                              uVar3 << 0x18);
          pcVar12 = acStack_12f + lVar4 + -4;
          break;
        case 0xd3:
          uVar7 = *(ulong *)(pcVar19 + -1);
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
          pcVar12 = acStack_12f + lVar10 * 0x10;
          break;
        default:
          if (bVar6 < 0xe0) {
            pcStack_270 = (code *)0x139276;
            test_read_num<double,long_long,int(*)(char_const**,double*)>();
            goto LAB_00139276;
          }
          pcVar12 = acStack_12f + (lVar10 * 2 + -1) * 8;
        }
        if (uVar7 != local_268) goto LAB_001392c8;
      }
      else {
        if (bVar6 != 0xcb) goto LAB_00139280;
        uVar7 = *(ulong *)(pcVar19 + -1);
        dVar9 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                         (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                         (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
        if ((dVar9 != local_250) || (NAN(dVar9) || NAN(local_250))) {
          pcStack_270 = (code *)0x1392a4;
          test_read_num<double,long_long,int(*)(char_const**,double*)>();
          goto LAB_001392a4;
        }
        pcVar12 = acStack_12f + lVar10 * 0x10;
      }
      unaff_RBP = pcVar19 + -2;
      pcVar17 = (char *)(ulong)(uint)(int)(char)bVar6;
      local_248 = 0.0;
      pcStack_270 = (code *)0x139157;
      local_260 = unaff_RBP;
      iVar2 = (*local_240)(&local_260,&local_248);
      if ((char)local_254 == '\0') {
        pcStack_270 = (code *)0x139227;
        _ok((uint)(iVar2 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",pcVar17);
        bVar20 = unaff_RBP == local_260;
        pcVar12 = "mp_num_pos2 == mp_nums[i]";
        iVar2 = 0x738;
        fmt = "check position";
      }
      else {
        unaff_RBP = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x139191;
        _ok((uint)(iVar2 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",pcVar17);
        pcStack_270 = (code *)0x1391b9;
        _ok((uint)(pcVar12 == local_260),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        bVar20 = ABS(local_250 - local_248) < 1e-15;
        pcVar12 = "double_eq(num1, num2)";
        iVar2 = 0x73e;
        fmt = "check float number";
      }
      mp_nums_00 = (char (*) [16])(ulong)bVar20;
      pcStack_270 = (code *)0x13924f;
      _ok((uint)bVar20,pcVar12,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar2,fmt);
      lVar10 = lVar10 + 1;
      pcVar19 = pcVar19 + 0x10;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  return;
LAB_001393db:
  bVar6 = *pbVar5;
  uVar15 = (ulong)bVar6;
  mVar1 = mp_type_hint[uVar15];
  if (mVar1 == MP_UINT) {
    if (bVar6 == 0xce) {
      uVar3 = *(uint *)(pbVar5 + 1);
      uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      pbVar11 = pbVar5 + 5;
LAB_001394a6:
      if (uVar7 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar6 == 0xcf) {
        uVar7 = *(ulong *)(pbVar5 + 1);
        uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38;
        pbVar11 = pbVar5 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar6 - 0xcc) && ((char)bVar6 < '\0')) {
        pcStack_4b8 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_4b8 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar6 = (byte)uVar15;
    uVar3 = extraout_EDX;
LAB_001395b5:
    if ((1 < uVar3 - 0xd0) && (bVar6 < 0xe0)) {
LAB_00139617:
      pcStack_4b8 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_6d8,"typed read of ",0xf);
      pacStack_4d0 = mp_nums_00;
      uStack_4c8 = uVar16;
      puStack_4c0 = puVar18;
      pcStack_4b8 = (code *)abStack_390;
      iVar2 = snprintf(acStack_6d8 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar17 = acStack_6d8 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar17,(size_t)(&uStack_5d8 + -(long)pcVar17)," into ");
      snprintf(pcVar17 + iVar2,(size_t)(&uStack_5d8 + -(long)(pcVar17 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_6d8,_stdout);
      fputc(10,_stdout);
      puStack_6e0 = &uStack_5d8;
      uStack_5d8 = 0xcb;
      uStack_5d7 = 0xb81e85eb513816c0;
      dStack_6e8 = 0.0;
      iVar2 = (*pcVar13)(&puStack_6e0,&dStack_6e8);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_5cf == puStack_6e0),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_6e8) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_4b8 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_4b8 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_4b8 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar6 != 0xca) {
LAB_001395f3:
      pcStack_4b8 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar3 = *(uint *)(pbVar5 + 1);
    fVar8 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    if ((fVar8 == 6.565e+06) && (!NAN(fVar8))) {
      pbVar11 = pbVar5 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar6 != 0xd2) {
      uVar3 = (uint)bVar6;
      if (bVar6 == 0xd3) {
        uVar15 = *(ulong *)(pbVar5 + 1);
        uVar15 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                 (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                 (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                 (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
        pbVar11 = pbVar5 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar3 = *(uint *)(pbVar5 + 1);
    pbVar11 = pbVar5 + 5;
    uVar15 = (ulong)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
LAB_001394c0:
    if (uVar15 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar6 != 0xcb) goto LAB_001395cf;
  uVar15 = *(ulong *)(pbVar5 + 1);
  dVar9 = (double)(uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                   (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                   (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                   (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
  if ((dVar9 != 6565000.0) || (NAN(dVar9))) {
    pcStack_4b8 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar11 = pbVar5 + 9;
LAB_001394cd:
  puVar18 = (undefined *)(ulong)(uint)(int)(char)bVar6;
  dStack_4b0 = 0.0;
  pcStack_4b8 = (code *)0x1394e8;
  pbStack_4a8 = pbVar5;
  iVar2 = (*(code *)mp_nums_00)(&pbStack_4a8,&dStack_4b0);
  pcStack_4b8 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar18);
  pcStack_4b8 = (code *)0x139538;
  _ok((uint)(pbVar11 == pbStack_4a8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar20 = ABS(6565000.0 - dStack_4b0) < 1e-15;
  pcVar13 = (code *)(ulong)bVar20;
  pcStack_4b8 = (code *)0x13957c;
  _ok((uint)bVar20,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar14 = (char)uVar16;
  uVar16 = 0;
  pbVar5 = abStack_390;
  if (cVar14 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}